

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O0

void __thiscall Epoll::epoll_add(Epoll *this,int fd,int event,EventCallback *cb)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  log_level lVar4;
  pointer ppVar5;
  mapped_type *pmVar6;
  Logger *pLVar7;
  undefined1 local_44 [8];
  epoll_event ev;
  _Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false> local_30;
  iterator ret;
  int op;
  int final_events;
  EventCallback *cb_local;
  int event_local;
  int fd_local;
  Epoll *this_local;
  
  cb_local._0_4_ = event;
  cb_local._4_4_ = fd;
  _event_local = this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_Epoll::io_event,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>_>
       ::find(&this->ep_event_map,(key_type *)((long)&cb_local + 4));
  ev.data = (epoll_data_t)
            std::
            unordered_map<int,_Epoll::io_event,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>_>
            ::end(&this->ep_event_map);
  bVar2 = std::__detail::operator==
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false> *)&ev.data);
  if (bVar2) {
    ret.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>._M_cur._4_4_ =
         (uint)cb_local;
    ret.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>._M_cur._0_4_ = 1;
  }
  else {
    ppVar5 = std::__detail::_Node_iterator<std::pair<const_int,_Epoll::io_event>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_int,_Epoll::io_event>,_false,_false> *)
                        &local_30);
    ret.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>._M_cur._4_4_ =
         (ppVar5->second).event | (uint)cb_local;
    ret.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>._M_cur._0_4_ = 3;
  }
  if (((uint)cb_local & 1) == 0) {
    if (((uint)cb_local & 4) != 0) {
      pmVar6 = std::
               unordered_map<int,_Epoll::io_event,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>_>
               ::operator[](&this->ep_event_map,(key_type *)((long)&cb_local + 4));
      std::function<void_()>::operator=(&pmVar6->write_callback,cb);
    }
  }
  else {
    pmVar6 = std::
             unordered_map<int,_Epoll::io_event,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>_>
             ::operator[](&this->ep_event_map,(key_type *)((long)&cb_local + 4));
    std::function<void_()>::operator=(&pmVar6->read_callback,cb);
  }
  uVar1 = ret.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>._M_cur._4_4_;
  pmVar6 = std::
           unordered_map<int,_Epoll::io_event,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>_>
           ::operator[](&this->ep_event_map,(key_type *)((long)&cb_local + 4));
  pmVar6->event = uVar1;
  local_44._0_4_ =
       ret.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>._M_cur._4_4_;
  local_44._4_4_ = cb_local._4_4_;
  iVar3 = epoll_ctl(this->ep_epoll_fd,
                    (int)ret.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>
                         ._M_cur,cb_local._4_4_,(epoll_event *)local_44);
  if (iVar3 == -1) {
    if (-1 < pr_level) {
      printf("[%-5s][%s:%d] epoll ctl error for fd %d\n","error","epoll_add",0x2e,
             (ulong)cb_local._4_4_);
    }
  }
  else {
    pLVar7 = Logger::get_instance();
    bVar2 = Logger::is_inited(pLVar7);
    if ((!bVar2) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","epoll_add",0x31);
    }
    lVar4 = Logger::get_log_level();
    if (1 < (int)lVar4) {
      pLVar7 = Logger::get_instance();
      Logger::write_log(pLVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/epoll.cpp"
                        ,"epoll_add",0x31,LOG_LEVEL_INFO,"epoll add, fd is %d, event is %d\n",
                        cb_local._4_4_,
                        ret.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>.
                        _M_cur._4_4_);
      pLVar7 = Logger::get_instance();
      Logger::flush(pLVar7);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              (&this->ep_listen_fds,(value_type_conflict1 *)((long)&cb_local + 4));
  }
  return;
}

Assistant:

void Epoll::epoll_add(int fd, int event, const EventCallback& cb) {
    int final_events;
    int op;

    if (auto ret = ep_event_map.find(fd); ret == ep_event_map.end()) {
        final_events = event;    
        op = EPOLL_CTL_ADD;
    }
    else {
        final_events = ret->second.event | event;
        op = EPOLL_CTL_MOD;
    }

    if (event & EPOLLIN) {
        ep_event_map[fd].read_callback = cb;
    }
    else if (event & EPOLLOUT) {
        ep_event_map[fd].write_callback = cb;
    }
    
    ep_event_map[fd].event = final_events;

    struct epoll_event ev;
    ev.events = final_events;
    ev.data.fd = fd;
    if (epoll_ctl(ep_epoll_fd, op, fd, &ev) == -1) {
        PR_ERROR("epoll ctl error for fd %d\n", fd);
        return;
    }
LOG_INFO("epoll add, fd is %d, event is %d\n", fd, final_events);
    ep_listen_fds.insert(fd);
}